

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * ODDLParser::OpenDDLParser::parseName(char *in,char *end,Name **name)

{
  byte bVar1;
  Text *id_00;
  Name *this;
  Text *id;
  
  *name = (Name *)0x0;
  if (in != end && in != (char *)0x0) {
    in = lookForNextToken<char>(in,end);
    bVar1 = *in;
    if ((bVar1 & 0xfe) == 0x24) {
      id = (Text *)0x0;
      in = parseIdentifier((char *)((byte *)in + 1),end,&id);
      id_00 = id;
      if (id != (Text *)0x0) {
        this = (Name *)operator_new(0x10);
        Name::Name(this,(uint)(bVar1 == 0x25),id_00);
        *name = this;
      }
    }
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseName( char *in, char *end, Name **name ) {
    *name = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    // ignore blanks
    in = lookForNextToken( in, end );
    if( *in != '$' && *in != '%' ) {
        return in;
    }

    NameType ntype( GlobalName );
    if( *in == '%' ) {
        ntype = LocalName;
    }
    in++;
    Name *currentName( ddl_nullptr );
    Text *id( ddl_nullptr );
    in = parseIdentifier( in, end, &id );
    if( id ) {
        currentName = new Name( ntype, id );
        if( currentName ) {
            *name = currentName;
        }
    }

    return in;
}